

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O0

void dg::dda::joinDefinitions(Definitions *from,Definitions *to,bool escaping)

{
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *this;
  long in_RSI;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *unaff_retaddr;
  __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
  in_stack_00000008;
  __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
  in_stack_00000010;
  const_iterator in_stack_00000018;
  bool in_stack_000000a7;
  DefinitionsMap<dg::dda::RWNode> *in_stack_000000a8;
  DefinitionsMap<dg::dda::RWNode> *in_stack_000000b0;
  __normal_iterator<dg::dda::RWNode_*const_*,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
  *in_stack_ffffffffffffffc0;
  
  joinDefinitions(in_stack_000000b0,in_stack_000000a8,in_stack_000000a7);
  this = (vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)(in_RSI + 0x78);
  std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end(this);
  __gnu_cxx::
  __normal_iterator<dg::dda::RWNode*const*,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>
  ::__normal_iterator<dg::dda::RWNode**>
            (in_stack_ffffffffffffffc0,
             (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
              *)this);
  std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::begin(this);
  std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end(this);
  std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
  insert<__gnu_cxx::__normal_iterator<dg::dda::RWNode**,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>,void>
            (unaff_retaddr,in_stack_00000018,in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

static void joinDefinitions(Definitions &from, Definitions &to,
                            bool escaping = false) {
    joinDefinitions(from.definitions, to.definitions, escaping);
    to.unknownWrites.insert(to.unknownWrites.end(), from.unknownWrites.begin(),
                            from.unknownWrites.end());
    // we ignore 'kills' and 'unknownReads' as this function is used
    // only when searching for all definitions
}